

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

int __thiscall just::process::impl::output_file::close(output_file *this,int __fd)

{
  int iVar1;
  fd_t fVar2;
  output_file *this_local;
  
  iVar1 = this->_fd;
  fVar2 = invalid_fd();
  if (iVar1 != fVar2) {
    ::close(this->_fd);
    fVar2 = invalid_fd();
    this->_fd = fVar2;
    return (int)this;
  }
  __assert_fail("_fd != invalid_fd()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/process.hpp"
                ,0x108,"void just::process::impl::output_file::close()");
}

Assistant:

void close()
        {
          assert(_fd != invalid_fd());
#ifdef _WIN32
          CloseHandle(_fd);
#else
          ::close(_fd);
#endif
          _fd = invalid_fd();
        }